

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

int __thiscall ThreadPool::busyThreads(ThreadPool *this)

{
  int iVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  ThreadPool *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mMutex);
  iVar1 = this->mBusyThreads;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return iVar1;
}

Assistant:

int ThreadPool::busyThreads() const
{
    std::lock_guard<std::mutex> lock(mMutex);
    return mBusyThreads;
}